

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O1

OP2instrEntry * __thiscall musicBlock::getInstrument(musicBlock *this,uint channel,uchar note)

{
  uint uVar1;
  
  if (channel == 0xf) {
    if ((byte)(note + 0xae) < 0xd1) {
      return (OP2instrEntry *)0x0;
    }
    uVar1 = (uint)(byte)(note + 0x5d);
  }
  else {
    uVar1 = (this->driverdata).channelInstr[channel];
  }
  if (this->OPLinstruments == (OP2instrEntry *)0x0) {
    return (OP2instrEntry *)0x0;
  }
  return this->OPLinstruments + uVar1;
}

Assistant:

struct OP2instrEntry *musicBlock::getInstrument(uint channel, uchar note)
{
	uint instrnumber;

	if (channel == PERCUSSION)
	{
		if (note < 35 || note > 81)
			return NULL;		/* wrong percussion number */
		instrnumber = note + (128-35);
	}
	else
	{
		instrnumber = driverdata.channelInstr[channel];
	}

	if (OPLinstruments)
		return &OPLinstruments[instrnumber];
	else
		return NULL;
}